

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPersistentManifold.cpp
# Opt level: O2

int __thiscall
cbtPersistentManifold::addManifoldPoint
          (cbtPersistentManifold *this,cbtManifoldPoint *newPoint,bool isPredictive)

{
  cbtScalar *pcVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  void *pvVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  cbtManifoldPoint *pcVar33;
  cbtVector3 *pcVar34;
  cbtScalar cVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  cbtPersistentManifold *this_00;
  
  uVar38 = this->m_cachedPoints;
  if (uVar38 == 4) {
    this_00 = this;
    uVar38 = sortCachedPoints(this,newPoint);
    clearUserCache(this_00,this->m_pointCache + (int)uVar38);
  }
  else {
    this->m_cachedPoints = uVar38 + 1;
  }
  uVar3 = *(undefined8 *)newPoint->reactions_cache;
  uVar4 = *(undefined8 *)(newPoint->reactions_cache + 2);
  uVar5 = *(undefined8 *)(newPoint->reactions_cache + 4);
  uVar6 = *(undefined8 *)(newPoint->m_localPointA).m_floats;
  uVar7 = *(undefined8 *)((newPoint->m_localPointA).m_floats + 2);
  uVar8 = *(undefined8 *)(newPoint->m_localPointB).m_floats;
  uVar9 = *(undefined8 *)((newPoint->m_localPointB).m_floats + 2);
  uVar10 = *(undefined8 *)(newPoint->m_positionWorldOnB).m_floats;
  uVar11 = *(undefined8 *)((newPoint->m_positionWorldOnB).m_floats + 2);
  uVar12 = *(undefined8 *)(newPoint->m_positionWorldOnA).m_floats;
  uVar13 = *(undefined8 *)((newPoint->m_positionWorldOnA).m_floats + 2);
  uVar14 = *(undefined8 *)(newPoint->m_normalWorldOnB).m_floats;
  uVar15 = *(undefined8 *)((newPoint->m_normalWorldOnB).m_floats + 2);
  uVar16 = *(undefined8 *)&newPoint->m_distance1;
  uVar17 = *(undefined8 *)&newPoint->m_combinedRollingFriction;
  uVar18 = *(undefined8 *)&newPoint->m_combinedRestitution;
  iVar36 = newPoint->m_partId1;
  iVar37 = newPoint->m_index0;
  uVar19 = *(undefined8 *)&newPoint->m_index1;
  pvVar20 = newPoint->m_userPersistentData;
  uVar21 = *(undefined8 *)&newPoint->m_contactPointFlags;
  uVar22 = *(undefined8 *)&newPoint->m_appliedImpulseLateral1;
  uVar23 = *(undefined8 *)&newPoint->m_contactMotion1;
  uVar24 = *(undefined8 *)&newPoint->field_22;
  uVar25 = *(undefined8 *)&newPoint->m_frictionCFM;
  cVar35 = newPoint->m_appliedImpulseLateral2;
  uVar26 = *(undefined8 *)&newPoint->m_contactMotion1;
  uVar27 = *(undefined8 *)&newPoint->field_22;
  uVar28 = *(undefined8 *)&newPoint->m_frictionCFM;
  uVar29 = *(undefined8 *)(newPoint->m_lateralFrictionDir1).m_floats;
  uVar30 = *(undefined8 *)((newPoint->m_lateralFrictionDir1).m_floats + 2);
  uVar31 = *(undefined8 *)(newPoint->m_lateralFrictionDir2).m_floats;
  uVar32 = *(undefined8 *)((newPoint->m_lateralFrictionDir2).m_floats + 2);
  uVar38 = ~((int)uVar38 >> 0x1f) & uVar38;
  pcVar33 = this->m_pointCache + uVar38;
  pcVar1 = &pcVar33->m_appliedImpulseLateral1;
  pcVar33->m_appliedImpulseLateral1 = newPoint->m_appliedImpulseLateral1;
  pcVar33->m_appliedImpulseLateral2 = cVar35;
  *(undefined8 *)(pcVar1 + 2) = uVar26;
  *(undefined8 *)(pcVar1 + 4) = uVar27;
  *(undefined8 *)(pcVar1 + 6) = uVar28;
  *(undefined8 *)((cbtVector3 *)(pcVar1 + 8))->m_floats = uVar29;
  *(undefined8 *)(pcVar1 + 10) = uVar30;
  *(undefined8 *)((cbtVector3 *)(pcVar1 + 0xc))->m_floats = uVar31;
  *(undefined8 *)(pcVar1 + 0xe) = uVar32;
  pcVar33 = this->m_pointCache + uVar38;
  piVar2 = &pcVar33->m_partId1;
  pcVar33->m_partId1 = iVar36;
  pcVar33->m_index0 = iVar37;
  *(undefined8 *)(piVar2 + 2) = uVar19;
  *(void **)(piVar2 + 4) = pvVar20;
  *(undefined8 *)(piVar2 + 6) = uVar21;
  *(undefined8 *)(piVar2 + 8) = uVar22;
  *(undefined8 *)(piVar2 + 10) = uVar23;
  *(undefined8 *)(piVar2 + 0xc) = uVar24;
  *(undefined8 *)(piVar2 + 0xe) = uVar25;
  pcVar34 = &this->m_pointCache[uVar38].m_positionWorldOnB;
  *(undefined8 *)(pcVar34->m_floats + 2) = uVar11;
  *(undefined8 *)pcVar34[1].m_floats = uVar12;
  *(undefined8 *)(pcVar34[1].m_floats + 2) = uVar13;
  *(undefined8 *)pcVar34[2].m_floats = uVar14;
  *(undefined8 *)(pcVar34[2].m_floats + 2) = uVar15;
  *(undefined8 *)(pcVar34 + 3) = uVar16;
  *(undefined8 *)((long)(pcVar34 + 3) + 8) = uVar17;
  *(undefined8 *)(pcVar34 + 4) = uVar18;
  pcVar33 = this->m_pointCache + uVar38;
  *(undefined8 *)pcVar33->reactions_cache = uVar3;
  *(undefined8 *)(pcVar33->reactions_cache + 2) = uVar4;
  *(undefined8 *)(pcVar33->reactions_cache + 4) = uVar5;
  *(undefined8 *)(pcVar33->m_localPointA).m_floats = uVar6;
  *(undefined8 *)((pcVar33->m_localPointA).m_floats + 2) = uVar7;
  *(undefined8 *)(pcVar33->m_localPointB).m_floats = uVar8;
  *(undefined8 *)((pcVar33->m_localPointB).m_floats + 2) = uVar9;
  *(undefined8 *)(pcVar33->m_positionWorldOnB).m_floats = uVar10;
  return uVar38;
}

Assistant:

int cbtPersistentManifold::addManifoldPoint(const cbtManifoldPoint& newPoint, bool isPredictive)
{
	if (!isPredictive)
	{
		cbtAssert(validContactDistance(newPoint));
	}

	int insertIndex = getNumContacts();
	if (insertIndex == MANIFOLD_CACHE_SIZE)
	{
#if MANIFOLD_CACHE_SIZE >= 4
		//sort cache so best points come first, based on area
		insertIndex = sortCachedPoints(newPoint);
#else
		insertIndex = 0;
#endif
		clearUserCache(m_pointCache[insertIndex]);
	}
	else
	{
		m_cachedPoints++;
	}
	if (insertIndex < 0)
		insertIndex = 0;

	cbtAssert(m_pointCache[insertIndex].m_userPersistentData == 0);
	m_pointCache[insertIndex] = newPoint;
	return insertIndex;
}